

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void proto2_unittest::TestOneofParsingLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  int iVar1;
  int iVar2;
  InlineRep *src;
  ulong uVar3;
  CordRep *pCVar4;
  _func_int **pp_Var5;
  InlineRep *this;
  string *value;
  undefined1 *this_00;
  Arena *this_01;
  
  this_01 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)this_01 & 1) != 0) {
    this_01 = *(Arena **)((ulong)this_01 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    MergeImpl();
LAB_001e400c:
    this = (InlineRep *)operator_new(0x10);
LAB_001e3f63:
    (this->data_).rep_.field_0.as_tree.cordz_info = 0;
    (this->data_).rep_.field_0.as_tree.rep = (CordRep *)0x0;
    to_msg[1]._vptr_MessageLite = (_func_int **)this;
LAB_001e3f6d:
    src = (InlineRep *)from_msg[1]._vptr_MessageLite;
    if (this != src) {
      if ((((this->data_).rep_.field_0.data[0] & 1U) == 0) &&
         (((src->data_).rep_.field_0.data[0] & 1U) == 0)) {
        pCVar4 = (src->data_).rep_.field_0.as_tree.rep;
        (this->data_).rep_.field_0.as_tree.cordz_info = (src->data_).rep_.field_0.as_tree.cordz_info
        ;
        (this->data_).rep_.field_0.as_tree.rep = pCVar4;
      }
      else {
        absl::lts_20250127::Cord::InlineRep::AssignSlow(this,src);
      }
    }
    goto switchD_001e3e1c_default;
  }
  iVar1 = *(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4);
  if (iVar1 == 0) goto switchD_001e3e1c_default;
  iVar2 = *(int *)((long)&to_msg[1]._internal_metadata_.ptr_ + 4);
  if (iVar2 != iVar1) {
    if (iVar2 != 0) {
      clear_oneof_field((TestOneofParsingLite *)to_msg);
    }
    *(int *)((long)&to_msg[1]._internal_metadata_.ptr_ + 4) = iVar1;
  }
  switch(iVar1) {
  case 1:
  case 9:
    *(undefined4 *)&to_msg[1]._vptr_MessageLite = *(undefined4 *)&from_msg[1]._vptr_MessageLite;
    goto switchD_001e3e1c_default;
  case 2:
    if (iVar2 == iVar1) {
      TestAllTypesLite::MergeImpl
                ((MessageLite *)to_msg[1]._vptr_MessageLite,
                 (MessageLite *)from_msg[1]._vptr_MessageLite);
    }
    else {
      pp_Var5 = (_func_int **)
                google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                          (this_01,from_msg[1]._vptr_MessageLite);
      to_msg[1]._vptr_MessageLite = pp_Var5;
    }
    goto switchD_001e3e1c_default;
  case 3:
    if (iVar2 != iVar1) {
      to_msg[1]._vptr_MessageLite =
           (_func_int **)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4) == 3) goto LAB_001e3f0f;
LAB_001e3ee8:
    value = (string *)&google::protobuf::internal::fixed_address_empty_string;
    break;
  case 4:
    if (iVar2 != iVar1) {
      to_msg[1]._vptr_MessageLite =
           (_func_int **)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4) == 4) {
LAB_001e3f37:
      value = (string *)((ulong)from_msg[1]._vptr_MessageLite & 0xfffffffffffffffc);
    }
    else {
      value = (string *)Impl_::_i_give_permission_to_break_this_code_default_oneof_bytes_._32_8_;
      if (Impl_::_i_give_permission_to_break_this_code_default_oneof_bytes_._32_8_ == 0) {
        this_00 = Impl_::_i_give_permission_to_break_this_code_default_oneof_bytes_;
LAB_001e4022:
        value = google::protobuf::internal::LazyString::Init_abi_cxx11_((LazyString *)this_00);
      }
    }
    break;
  case 5:
    if (iVar2 != iVar1) {
      to_msg[1]._vptr_MessageLite =
           (_func_int **)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4) == 5) goto LAB_001e3f37;
    value = (string *)Impl_::_i_give_permission_to_break_this_code_default_oneof_string_cord_._32_8_
    ;
    if (Impl_::_i_give_permission_to_break_this_code_default_oneof_string_cord_._32_8_ == 0) {
      this_00 = Impl_::_i_give_permission_to_break_this_code_default_oneof_string_cord_;
      goto LAB_001e4022;
    }
    break;
  case 6:
    if (iVar2 != iVar1) {
      if (this_01 == (Arena *)0x0) goto LAB_001e400c;
      this = (InlineRep *)
             google::protobuf::Arena::AllocateAlignedWithCleanup
                       (this_01,0x10,8,
                        google::protobuf::internal::cleanup::
                        arena_destruct_object<absl::lts_20250127::Cord>);
      goto LAB_001e3f63;
    }
    this = (InlineRep *)to_msg[1]._vptr_MessageLite;
    goto LAB_001e3f6d;
  case 7:
    if (iVar2 != iVar1) {
      to_msg[1]._vptr_MessageLite =
           (_func_int **)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4) != 7) goto LAB_001e3ee8;
LAB_001e3f0f:
    value = (string *)((ulong)from_msg[1]._vptr_MessageLite & 0xfffffffffffffffc);
    break;
  case 8:
    if (iVar2 != iVar1) {
      to_msg[1]._vptr_MessageLite =
           (_func_int **)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4) == 8) goto LAB_001e3f37;
    value = (string *)
            Impl_::_i_give_permission_to_break_this_code_default_oneof_bytes_string_piece_._32_8_;
    if (Impl_::_i_give_permission_to_break_this_code_default_oneof_bytes_string_piece_._32_8_ == 0)
    {
      this_00 = Impl_::_i_give_permission_to_break_this_code_default_oneof_bytes_string_piece_;
      goto LAB_001e4022;
    }
    break;
  default:
    goto switchD_001e3e1c_default;
  }
  google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(to_msg + 1),value,this_01);
switchD_001e3e1c_default:
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&to_msg->_internal_metadata_,(string *)((uVar3 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void TestOneofParsingLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestOneofParsingLite*>(&to_msg);
  auto& from = static_cast<const TestOneofParsingLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestOneofParsingLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofInt32: {
        _this->_impl_.oneof_field_.oneof_int32_ = from._impl_.oneof_field_.oneof_int32_;
        break;
      }
      case kOneofSubmessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_submessage_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_submessage_);
        } else {
          _this->_impl_.oneof_field_.oneof_submessage_->MergeFrom(*from._impl_.oneof_field_.oneof_submessage_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case kOneofStringCord: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_cord_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_cord_.Set(from._internal_oneof_string_cord(), arena);
        break;
      }
      case kOneofBytesCord: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_cord_ = ::google::protobuf::Arena::Create<absl::Cord>(arena);
        }
        *_this->_impl_.oneof_field_.oneof_bytes_cord_ = *from._impl_.oneof_field_.oneof_bytes_cord_;
        break;
      }
      case kOneofStringStringPiece: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_string_piece_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_string_piece_.Set(from._internal_oneof_string_string_piece(), arena);
        break;
      }
      case kOneofBytesStringPiece: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_string_piece_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_string_piece_.Set(from._internal_oneof_bytes_string_piece(), arena);
        break;
      }
      case kOneofEnum: {
        _this->_impl_.oneof_field_.oneof_enum_ = from._impl_.oneof_field_.oneof_enum_;
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}